

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

int translate_mod(int state)

{
  int mod_keys;
  int state_local;
  
  mod_keys = (int)((state & 1U) != 0);
  if ((state & 4U) != 0) {
    mod_keys = mod_keys | 2;
  }
  if ((state & 8U) != 0) {
    mod_keys = mod_keys | 4;
  }
  if ((state & 0x40U) != 0) {
    mod_keys = mod_keys | 8;
  }
  if ((state & 2U) != 0) {
    mod_keys = mod_keys | 0x10;
  }
  if ((state & 0x10U) != 0) {
    mod_keys = mod_keys | 0x20;
  }
  return mod_keys;
}

Assistant:

int 
translate_mod(int state) {
    int mod_keys = 0;

    if (state & ShiftMask)
        mod_keys |= KB_MOD_SHIFT;
    if (state & ControlMask)
        mod_keys |= KB_MOD_CONTROL;
    if (state & Mod1Mask)
        mod_keys |= KB_MOD_ALT;
    if (state & Mod4Mask)
        mod_keys |= KB_MOD_SUPER;
    if (state & LockMask)
        mod_keys |= KB_MOD_CAPS_LOCK;
    if (state & Mod2Mask)
        mod_keys |= KB_MOD_NUM_LOCK;

    return mod_keys;
}